

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_ugawg_node(REF_NODE ref_node,REF_INT version)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double local_158;
  double local_138;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL factor;
  REF_DBL dd;
  REF_DBL h;
  double dStack_f8;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  REF_DBL d [12];
  REF_DBL d0;
  REF_DBL h0;
  REF_DBL h_r;
  REF_DBL h_t;
  REF_DBL h_z;
  REF_DBL t;
  REF_DBL r;
  REF_DBL y;
  REF_DBL x;
  REF_INT node;
  REF_INT version_local;
  REF_NODE ref_node_local;
  
  if ((version == 1) || (version == 2)) {
    for (x._0_4_ = 0; x._0_4_ < ref_node->max; x._0_4_ = x._0_4_ + 1) {
      if (((-1 < x._0_4_) && (x._0_4_ < ref_node->max)) && (-1 < ref_node->global[x._0_4_])) {
        dVar2 = ref_node->real[x._0_4_ * 0xf];
        dVar3 = ref_node->real[x._0_4_ * 0xf + 1];
        local_138 = sqrt(dVar2 * dVar2 + dVar3 * dVar3);
        dVar2 = atan2(dVar3,dVar2);
        if (local_138 - 0.5 <= 0.0) {
          local_138 = -(local_138 - 0.5);
        }
        else {
          local_138 = local_138 - 0.5;
        }
        dVar3 = local_138 * 0.198 + 0.001;
        m[5] = 1.0 / (dVar3 * dVar3);
        cos(dVar2);
        sin(dVar2);
        sin(dVar2);
        cos(dVar2);
        ref_matrix_form_m(m + 5,&stack0xffffffffffffff08);
        uVar1 = ref_node_metric_set(ref_node,x._0_4_,&stack0xffffffffffffff08);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x136,"ref_metric_ugawg_node",(ulong)uVar1,"set node met");
          return uVar1;
        }
      }
    }
    ref_node_local._4_4_ = 0;
  }
  else if (version == 3) {
    for (x._0_4_ = 0; x._0_4_ < ref_node->max; x._0_4_ = x._0_4_ + 1) {
      if (((-1 < x._0_4_) && (x._0_4_ < ref_node->max)) && (-1 < ref_node->global[x._0_4_])) {
        local_158 = ref_node->real[x._0_4_ * 0xf + 1];
        if (-local_158 + 2.0 <= local_158) {
          local_158 = -local_158 + 2.0;
        }
        dVar2 = pow(1.0,-2.0);
        dVar3 = tanh((local_158 * 2.3) / 1.0 - 0.96);
        dStack_f8 = pow(dVar3 * 0.042 + 0.088,-2.0);
        dStack_f8 = dVar2 * 1.0 * dStack_f8;
        m[0] = 0.0;
        m[1] = 0.0;
        dVar2 = pow(1.0,-2.0);
        dVar3 = tanh((local_158 * 3.4) / 1.0);
        dVar3 = pow(dVar3 * 0.06 + 0.0022,-2.0);
        m[2] = dVar2 * 1.0 * dVar3;
        m[3] = 0.0;
        dVar2 = pow(1.0,-2.0);
        dVar3 = tanh((local_158 * 1.2) / 1.0 - 0.24);
        dVar3 = pow(dVar3 * 0.08 + 0.045,-2.0);
        m[4] = dVar2 * 1.0 * dVar3;
        uVar1 = ref_node_metric_set(ref_node,x._0_4_,&stack0xffffffffffffff08);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x14d,"ref_metric_ugawg_node",(ulong)uVar1,"set node met");
          return uVar1;
        }
      }
    }
    ref_node_local._4_4_ = 0;
  }
  else {
    ref_node_local._4_4_ = 6;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_ugawg_node(REF_NODE ref_node, REF_INT version) {
  REF_INT node;
  REF_DBL x, y, r, t;
  REF_DBL h_z, h_t, h_r, h0, d0;
  REF_DBL d[12], m[6];

  if (1 == version || 2 == version) {
    each_ref_node_valid_node(ref_node, node) {
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      r = sqrt(x * x + y * y);
      t = atan2(y, x);
      h_z = 0.1;
      h_t = 0.1;
      h0 = 0.001;
      h_r = h0 + 2 * (0.1 - h0) * ABS(r - 0.5);
      if (2 == version) {
        d0 = MIN(10.0 * ABS(r - 0.5), 1.0);
        h_t = 0.1 * d0 + 0.025 * (1.0 - d0);
      }
      ref_matrix_eig(d, 0) = 1.0 / (h_r * h_r);
      ref_matrix_eig(d, 1) = 1.0 / (h_t * h_t);
      ref_matrix_eig(d, 2) = 1.0 / (h_z * h_z);
      ref_matrix_vec(d, 0, 0) = cos(t);
      ref_matrix_vec(d, 1, 0) = sin(t);
      ref_matrix_vec(d, 2, 0) = 0.0;
      ref_matrix_vec(d, 0, 1) = -sin(t);
      ref_matrix_vec(d, 1, 1) = cos(t);
      ref_matrix_vec(d, 2, 1) = 0.0;
      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_form_m(d, m);
      RSS(ref_node_metric_set(ref_node, node, m), "set node met");
    }
    return REF_SUCCESS;
  }

  if (3 == version) { /* larsson3 */
    each_ref_node_valid_node(ref_node, node) {
      REF_DBL h = 1.0;
      REF_DBL dd;
      REF_DBL factor = 1.0;

      y = ref_node_xyz(ref_node, 1, node);

      dd = MIN(y, 2 * h - y);
      m[0] = factor * pow(h, -2) *
             pow(0.088 + 0.042 * tanh(2.3 * dd / h - 0.96), -2);
      m[1] = 0.0;
      m[2] = 0.0;
      m[3] = factor * pow(h, -2) * pow(0.0022 + 0.06 * tanh(3.4 * dd / h), -2);
      m[4] = 0.0;
      m[5] = factor * pow(h, -2) *
             pow(0.045 + 0.08 * tanh(1.2 * dd / h - 0.24), -2);

      RSS(ref_node_metric_set(ref_node, node, m), "set node met");
    }
    return REF_SUCCESS;
  }
  return REF_IMPLEMENT;
}